

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNCalls_Fulfilled_Test::testBody
          (TEST_MockCallTest_expectNCalls_Fulfilled_Test *this)

{
  MockSupport *pMVar1;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockCallTest_expectNCalls_Fulfilled_Test *local_10;
  TEST_MockCallTest_expectNCalls_Fulfilled_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar1 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"boo");
  (*pMVar1->_vptr_MockSupport[5])(pMVar1,2,local_40);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_50,"");
  pMVar1 = mock(&local_50,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_60,"boo");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_60);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::SimpleString(&local_70,"");
  pMVar1 = mock(&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"boo");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_80);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::SimpleString(&local_90,"");
  pMVar1 = mock(&local_90,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_90);
  return;
}

Assistant:

TEST(MockCallTest, expectNCalls_Fulfilled)
{
    mock().expectNCalls(2, "boo");
    mock().actualCall("boo");
    mock().actualCall("boo");
    mock().checkExpectations();
}